

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_core_validation.cpp
# Opt level: O0

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info,string *command_name,
                         vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>
                         *objects_info,bool check_members,bool check_pnext,
                         XrBodyJointLocationFB *value)

{
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *pvVar1;
  string *psVar2;
  string local_2b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_290;
  allocator local_271;
  string local_270 [32];
  string local_250 [32];
  ostringstream local_230 [8];
  ostringstream oss_enum;
  allocator local_b1;
  string local_b0 [32];
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> local_90;
  allocator local_61;
  string local_60 [32];
  ValidateXrFlagsResult local_40;
  XrResult local_3c;
  ValidateXrFlagsResult space_location_flags_result;
  XrResult xr_result;
  XrBodyJointLocationFB *value_local;
  bool check_pnext_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *pvStack_28;
  bool check_members_local;
  vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *objects_info_local;
  string *command_name_local;
  GenValidUsageXrInstanceInfo *instance_info_local;
  
  local_3c = XR_SUCCESS;
  if (check_members) {
    _space_location_flags_result = value;
    value_local._6_1_ = check_pnext;
    value_local._7_1_ = check_members;
    pvStack_28 = objects_info;
    objects_info_local =
         (vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_> *)
         command_name;
    command_name_local = (string *)instance_info;
    local_40 = ValidateXrSpaceLocationFlags(value->locationFlags);
    psVar2 = command_name_local;
    if (local_40 == VALIDATE_XR_FLAGS_ZERO) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_60,"VUID-XrBodyJointLocationFB-locationFlags-requiredbitmask",&local_61);
      pvVar1 = objects_info_local;
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_90,pvStack_28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_b0,"XrSpaceLocationFlags \"locationFlags\" flag must be non-zero",&local_b1);
      CoreValidLogMessage((GenValidUsageXrInstanceInfo *)psVar2,(string *)local_60,
                          VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)pvVar1,&local_90,
                          (string *)local_b0);
      std::__cxx11::string::~string(local_b0);
      std::allocator<char>::~allocator((allocator<char> *)&local_b1);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_90);
      std::__cxx11::string::~string(local_60);
      std::allocator<char>::~allocator((allocator<char> *)&local_61);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
    }
    else if (local_40 == VALIDATE_XR_FLAGS_SUCCESS) {
      instance_info_local._4_4_ = local_3c;
    }
    else {
      std::__cxx11::ostringstream::ostringstream(local_230);
      std::operator<<((ostream *)local_230,
                      "XrBodyJointLocationFB invalid member XrSpaceLocationFlags \"locationFlags\" flag value "
                     );
      Uint32ToHexString_abi_cxx11_((uint32_t)local_250);
      std::operator<<((ostream *)local_230,local_250);
      std::__cxx11::string::~string(local_250);
      std::operator<<((ostream *)local_230," contains illegal bit");
      psVar2 = command_name_local;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_270,"VUID-XrBodyJointLocationFB-locationFlags-parameter",&local_271);
      pvVar1 = objects_info_local;
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::vector
                (&local_290,pvStack_28);
      std::__cxx11::ostringstream::str();
      CoreValidLogMessage((GenValidUsageXrInstanceInfo *)psVar2,(string *)local_270,
                          VALID_USAGE_DEBUG_SEVERITY_ERROR,(string *)pvVar1,&local_290,local_2b0);
      std::__cxx11::string::~string((string *)local_2b0);
      std::vector<GenValidUsageXrObjectInfo,_std::allocator<GenValidUsageXrObjectInfo>_>::~vector
                (&local_290);
      std::__cxx11::string::~string(local_270);
      std::allocator<char>::~allocator((allocator<char> *)&local_271);
      instance_info_local._4_4_ = XR_ERROR_VALIDATION_FAILURE;
      std::__cxx11::ostringstream::~ostringstream(local_230);
    }
  }
  else {
    instance_info_local._4_4_ = XR_SUCCESS;
  }
  return instance_info_local._4_4_;
}

Assistant:

XrResult ValidateXrStruct(GenValidUsageXrInstanceInfo *instance_info, const std::string &command_name,
                          std::vector<GenValidUsageXrObjectInfo>& objects_info, bool check_members, bool check_pnext,
                          const XrBodyJointLocationFB* value) {
    XrResult xr_result = XR_SUCCESS;
    (void)xr_result;
    (void)instance_info;
    (void)command_name;
    (void)objects_info;
    (void)check_members;
    (void)value;
    // If we are not to check the rest of the members, just return here.
    if (!check_members || XR_SUCCESS != xr_result) {
        return xr_result;
    }
    ValidateXrFlagsResult space_location_flags_result = ValidateXrSpaceLocationFlags(value->locationFlags);
    // Flags must be non-zero in this case.
    if (VALIDATE_XR_FLAGS_ZERO == space_location_flags_result) {
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationFB-locationFlags-requiredbitmask",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, "XrSpaceLocationFlags \"locationFlags\" flag must be non-zero");
        return XR_ERROR_VALIDATION_FAILURE;
    } else if (VALIDATE_XR_FLAGS_SUCCESS != space_location_flags_result) {
        // Otherwise, flags must be valid.
        std::ostringstream oss_enum;
        oss_enum << "XrBodyJointLocationFB invalid member XrSpaceLocationFlags \"locationFlags\" flag value ";
        oss_enum << Uint32ToHexString(static_cast<uint32_t>(value->locationFlags));
        oss_enum <<" contains illegal bit";
        CoreValidLogMessage(instance_info, "VUID-XrBodyJointLocationFB-locationFlags-parameter",
                            VALID_USAGE_DEBUG_SEVERITY_ERROR, command_name,
                            objects_info, oss_enum.str());
        return XR_ERROR_VALIDATION_FAILURE;
    }
    // Everything checked out properly
    return xr_result;
}